

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_staj_visitor<char>::dump
          (basic_staj_visitor<char> *this,basic_json_visitor<char> *visitor,ser_context *context,
          error_code *ec)

{
  typed_array_view *ptVar1;
  typed_array_type tVar2;
  ulong uVar3;
  ulong uVar4;
  span<const_unsigned_char,_18446744073709551615UL> sVar5;
  span<const_unsigned_int,_18446744073709551615UL> sVar6;
  span<const_short,_18446744073709551615UL> sVar7;
  span<const_unsigned_short,_18446744073709551615UL> sVar8;
  span<const_int,_18446744073709551615UL> sVar9;
  span<const_long,_18446744073709551615UL> sVar10;
  span<const_unsigned_long,_18446744073709551615UL> sVar11;
  span<const_signed_char,_18446744073709551615UL> sVar12;
  span<const_double,_18446744073709551615UL> sVar13;
  span<const_float,_18446744073709551615UL> sVar14;
  span<const_double,_18446744073709551615UL> local_48;
  ser_context local_38;
  
  tVar2 = (this->data_).type_;
  if (tVar2 != 0) {
    ptVar1 = &this->data_;
    if (this->index_ == 0) {
      switch(tVar2) {
      case uint8_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<unsigned_char_const>
                  (visitor,(span<const_unsigned_char,_18446744073709551615UL> *)&local_48,none,
                   &local_38);
        break;
      case uint16_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<unsigned_short_const>
                  (visitor,(span<const_unsigned_short,_18446744073709551615UL> *)&local_48,none,
                   &local_38);
        break;
      case uint32_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<unsigned_int_const>
                  (visitor,(span<const_unsigned_int,_18446744073709551615UL> *)&local_48,none,
                   &local_38);
        break;
      case uint64_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<unsigned_long_const>
                  (visitor,(span<const_unsigned_long,_18446744073709551615UL> *)&local_48,none,
                   &local_38);
        break;
      case int8_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<signed_char_const>
                  (visitor,(span<const_signed_char,_18446744073709551615UL> *)&local_48,none,
                   &local_38);
        break;
      case int16_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<short_const>
                  (visitor,(span<const_short,_18446744073709551615UL> *)&local_48,none,&local_38);
        break;
      case int32_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<int_const>
                  (visitor,(span<const_int,_18446744073709551615UL> *)&local_48,none,&local_38);
        break;
      case int64_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<long_const>
                  (visitor,(span<const_long,_18446744073709551615UL> *)&local_48,none,&local_38);
        break;
      case float_value:
        local_48 = (span<const_double,_18446744073709551615UL>)typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<float_const>
                  (visitor,(span<const_float,_18446744073709551615UL> *)&local_48,none,&local_38);
        break;
      case double_value:
        local_48 = typed_array_view::data(ptVar1);
        local_38._vptr_ser_context = (_func_int **)&PTR__ser_context_00997908;
        basic_json_visitor<char>::typed_array<double_const>(visitor,&local_48,none,&local_38);
      }
      this->state_ = 0;
      (this->data_).type_ = 0;
    }
    else {
      basic_staj_event<char>::send_json_event(&this->event_,visitor,context,ec);
      tVar2 = (this->data_).type_;
      if (tVar2 - uint8_value < 0xb) {
        uVar3 = (this->data_).size_;
        switch(tVar2) {
        case uint8_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar5 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::uint64_value
                      (visitor,(ulong)sVar5.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case uint16_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar8 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::uint64_value
                      (visitor,(ulong)sVar8.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case uint32_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar6 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::uint64_value
                      (visitor,(ulong)sVar6.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case uint64_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar11 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::uint64_value
                      (visitor,sVar11.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case int8_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar12 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::int64_value
                      (visitor,(long)sVar12.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case int16_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar7 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::int64_value
                      (visitor,(long)sVar7.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case int32_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar9 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::int64_value
                      (visitor,(long)sVar9.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case int64_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar10 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::int64_value
                      (visitor,sVar10.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case float_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar14 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::double_value
                      (visitor,(double)sVar14.data_[uVar4],none,(ser_context *)&local_48);
          }
          break;
        case double_value:
          for (uVar4 = this->index_; uVar4 < uVar3; uVar4 = uVar4 + 1) {
            sVar13 = typed_array_view::data(ptVar1);
            local_48.data_ = (pointer)&PTR__ser_context_00997908;
            basic_json_visitor<char>::double_value
                      (visitor,sVar13.data_[uVar4],none,(ser_context *)&local_48);
          }
        }
      }
      this->state_ = 0;
      (this->data_).type_ = 0;
      this->index_ = 0;
    }
    (this->data_).data_.uint8_data_ = (uint8_t *)0x0;
    (this->data_).size_ = 0;
    return;
  }
  basic_staj_event<char>::send_json_event(&this->event_,visitor,context,ec);
  return;
}

Assistant:

void dump(basic_json_visitor<CharT>& visitor, const ser_context& context, std::error_code& ec)
    {
        if (is_typed_array())
        {
            if (index_ != 0)
            {
                event().send_json_event(visitor, context, ec);
                const std::size_t len = data_.size();
                switch (data_.type())
                {
                    case typed_array_type::uint8_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint8_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint16_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint16_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint32_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint32_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint64_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint64_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int8_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int8_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int16_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int16_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int32_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int32_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int64_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int64_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::float_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.double_value(data_.data(float_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::double_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.double_value(data_.data(double_array_arg)[i]);
                        }
                        break;
                    }
                    default:
                        break;
                }
                
                state_ = staj_cursor_state();
                data_ = typed_array_view();
                index_ = 0;
            }
            else
            {
                switch (data_.type())
                {
                    case typed_array_type::uint8_value:
                    {
                        visitor.typed_array(data_.data(uint8_array_arg));
                        break;
                    }
                    case typed_array_type::uint16_value:
                    {
                        visitor.typed_array(data_.data(uint16_array_arg));
                        break;
                    }
                    case typed_array_type::uint32_value:
                    {
                        visitor.typed_array(data_.data(uint32_array_arg));
                        break;
                    }
                    case typed_array_type::uint64_value:
                    {
                        visitor.typed_array(data_.data(uint64_array_arg));
                        break;
                    }
                    case typed_array_type::int8_value:
                    {
                        visitor.typed_array(data_.data(int8_array_arg));
                        break;
                    }
                    case typed_array_type::int16_value:
                    {
                        visitor.typed_array(data_.data(int16_array_arg));
                        break;
                    }
                    case typed_array_type::int32_value:
                    {
                        visitor.typed_array(data_.data(int32_array_arg));
                        break;
                    }
                    case typed_array_type::int64_value:
                    {
                        visitor.typed_array(data_.data(int64_array_arg));
                        break;
                    }
                    case typed_array_type::float_value:
                    {
                        visitor.typed_array(data_.data(float_array_arg));
                        break;
                    }
                    case typed_array_type::double_value:
                    {
                        visitor.typed_array(data_.data(double_array_arg));
                        break;
                    }
                    default:
                        break;
                }

                state_ = staj_cursor_state();
                data_ = typed_array_view();
            }
        }
        else
        {
            event().send_json_event(visitor, context, ec);
        }
    }